

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundFunction.cpp
# Opt level: O1

Var Js::BoundFunction::NewInstance(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *scriptContext;
  undefined8 uVar1;
  ThreadContext *pTVar2;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  BOOL BVar6;
  uint uVar7;
  undefined4 *puVar8;
  FunctionInfo *pFVar9;
  RecyclableObject *constructor;
  Recycler *this;
  Var pvVar10;
  JavascriptMethod entryPoint;
  RecyclableObject *pRVar11;
  uint uVar12;
  uint uVar13;
  CallInfo CVar14;
  uint count;
  uint uVar15;
  ulong uVar16;
  uint uVar17;
  size_t size;
  char *pcVar18;
  Type ppvVar19;
  uint in_stack_00000010;
  undefined1 local_b8 [8];
  TrackAllocData data;
  undefined1 local_58 [8];
  Arguments args;
  char *local_40;
  
  uVar15 = callInfo._0_4_;
  if (in_stack_00000010 != uVar15) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                ,0x67,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar4) goto LAB_00b34fc2;
    *puVar8 = 0;
  }
  args.Info = (Type)&stack0x00000018;
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_58 = (undefined1  [8])callInfo;
  if (((ulong)callInfo & 0xffffff) == 0) {
    JavascriptError::ThrowTypeError(scriptContext,-0x7ff5ec76,(PCWSTR)0x0);
  }
  pRVar11 = (RecyclableObject *)
            function[3].super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject;
  args.Values = (Type)function;
  if ((uVar15 >> 0x18 & 1) == 0) {
LAB_00b34a9d:
    constructor = (RecyclableObject *)0x0;
  }
  else if ((uVar15 >> 0x1e & 1) == 0) {
    bVar4 = VarIs<Js::JavascriptProxy,Js::RecyclableObject>(pRVar11);
    if (bVar4) {
      *(undefined8 *)args.Info = 0;
      goto LAB_00b34a9d;
    }
    pTVar2 = scriptContext->threadContext;
    bVar4 = pTVar2->reentrancySafeOrHandled;
    pTVar2->reentrancySafeOrHandled = true;
    constructor = (RecyclableObject *)JavascriptOperators::NewScObjectNoCtor(pRVar11,scriptContext);
    *(RecyclableObject **)args.Info = constructor;
    pTVar2->reentrancySafeOrHandled = bVar4;
  }
  else {
    pvVar10 = CallInfo::GetNewTarget
                        (callInfo._3_4_ &
                         (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                          CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                         CallFlags_New),(Var *)args.Info,uVar15 & 0xffffff);
    bVar4 = JavascriptOperators::IsConstructor(pvVar10);
    if (!bVar4) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                  ,0x7d,"(JavascriptOperators::IsConstructor(newTargetVar))",
                                  "newTarget must be a constructor");
      if (!bVar4) goto LAB_00b34fc2;
      *puVar8 = 0;
    }
    constructor = UnsafeVarTo<Js::RecyclableObject>(pvVar10);
    pFVar9 = JavascriptOperators::GetConstructorFunctionInfo(pRVar11,scriptContext);
    if ((pFVar9 == (FunctionInfo *)0x0) || ((pFVar9->attributes & ClassConstructor) == None)) {
      pTVar2 = scriptContext->threadContext;
      bVar4 = pTVar2->reentrancySafeOrHandled;
      pTVar2->reentrancySafeOrHandled = true;
      constructor = JavascriptOperators::CreateFromConstructor(constructor,scriptContext);
      *(RecyclableObject **)args.Info = constructor;
      pTVar2->reentrancySafeOrHandled = bVar4;
      function = (RecyclableObject *)args.Values;
    }
    else {
      *(RecyclableObject **)args.Info = constructor;
      function = (RecyclableObject *)args.Values;
    }
  }
  uVar17 = *(uint *)&function[4].super_FinalizableObject.super_IRecyclerVisitedObject.
                     _vptr_IRecyclerVisitedObject;
  if (uVar17 == 0) {
    CVar14 = (CallInfo)local_58;
    if ((uVar15 >> 0x18 & 1) == 0) {
      *(void **)args.Info = args.Values[7];
    }
  }
  else {
    uVar12 = local_58._0_4_;
    count = uVar12 & 0xffffff;
    uVar5 = CallInfo::GetLargeArgCountWithExtraArgs
                      (local_58._3_4_ &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),count);
    uVar13 = uVar5 + uVar17;
    if (CARRY4(uVar5,uVar17)) {
      ::Math::DefaultOverflowPolicy();
    }
    if (0xffffff < uVar13) {
      JavascriptError::ThrowRangeError(scriptContext,-0x7ff5ec52,(PCWSTR)0x0);
    }
    local_b8 = (undefined1  [8])&Memory::WriteBarrierPtr<void>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_5f772cc;
    data.filename._0_4_ = 0xb0;
    data.plusSize = (ulong)uVar13;
    this = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_b8);
    if (uVar13 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this,(TrackAllocData *)0x0);
      local_40 = &DAT_00000008;
    }
    else {
      BVar6 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar6 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00b34fc2;
        *puVar8 = 0;
      }
      size = (ulong)uVar13 << 3;
      local_40 = Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                           (this,size);
      if (local_40 == (char *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) goto LAB_00b34fc2;
        *puVar8 = 0;
      }
      memset(local_40,0,size);
    }
    ppvVar19 = args.Values;
    if ((uVar15 >> 0x18 & 1) == 0) {
      pvVar10 = args.Values[7];
    }
    else {
      pvVar10 = Arguments::operator[]((Arguments *)local_58,0);
    }
    Memory::Recycler::WBSetBit(local_40);
    *(Var *)local_40 = pvVar10;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(local_40);
    if (*(int *)(ppvVar19 + 8) == 0) {
      uVar5 = 1;
    }
    else {
      uVar16 = 0;
      pcVar18 = local_40;
      do {
        pcVar18 = pcVar18 + 8;
        uVar1 = *(undefined8 *)((long)ppvVar19[9] + uVar16 * 8);
        Memory::Recycler::WBSetBit(pcVar18);
        *(undefined8 *)pcVar18 = uVar1;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar18);
        uVar16 = uVar16 + 1;
      } while (uVar16 < *(uint *)(ppvVar19 + 8));
      uVar5 = (int)uVar16 + 1;
    }
    if (1 < count) {
      uVar17 = 1;
      do {
        pvVar10 = Arguments::operator[]((Arguments *)local_58,uVar17);
        pcVar18 = local_40 + (ulong)((uVar5 + uVar17) - 1) * 8;
        Memory::Recycler::WBSetBit(pcVar18);
        *(Var *)pcVar18 = pvVar10;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pcVar18);
        uVar17 = uVar17 + 1;
      } while (count != uVar17);
      uVar5 = (uVar5 + uVar17) - 1;
      ppvVar19 = args.Values;
    }
    bVar4 = CallInfo::HasExtraArg((uint)local_58[3]);
    if (bVar4) {
      uVar1 = *(undefined8 *)((long)args.Info + (ulong)(uVar12 & 0xffffff) * 8);
      uVar16 = (ulong)uVar5;
      uVar5 = uVar5 + 1;
      local_40 = local_40 + uVar16 * 8;
      Memory::Recycler::WBSetBit(local_40);
      ppvVar19 = args.Values;
      *(undefined8 *)local_40 = uVar1;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(local_40);
    }
    CVar14 = (CallInfo)
             ((ulong)local_58 & 0xffffffffff000000 |
             (ulong)(*(int *)(ppvVar19 + 8) + uVar12 & 0xffffff));
    uVar7 = CallInfo::GetLargeArgCountWithExtraArgs
                      (local_58._3_4_ &
                       (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|
                        CallFlags_NotUsed|CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|
                       CallFlags_New),CVar14._0_4_ & 0xffffff);
    if (uVar5 != uVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/BoundFunction.cpp"
                                  ,0xd3,"(index == actualArgs.GetLargeArgCountWithExtraArgs())",
                                  "index == actualArgs.GetLargeArgCountWithExtraArgs()");
      if (!bVar4) {
LAB_00b34fc2:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
  }
  pTVar2 = scriptContext->threadContext;
  bVar4 = pTVar2->reentrancySafeOrHandled;
  pTVar2->reentrancySafeOrHandled = true;
  entryPoint = RecyclableObject::GetEntryPoint(pRVar11);
  data._32_8_ = CVar14;
  pRVar11 = (RecyclableObject *)
            JavascriptFunction::CallFunction<true>(pRVar11,entryPoint,(Arguments *)&data.line,true);
  pTVar2->reentrancySafeOrHandled = bVar4;
  if (((uVar15 >> 0x18 & 1) != 0) && (BVar6 = JavascriptOperators::IsObject(pRVar11), BVar6 == 0)) {
    pRVar11 = constructor;
  }
  return pRVar11;
}

Assistant:

Var BoundFunction::NewInstance(RecyclableObject* function, CallInfo callInfo, ...)
    {
        RUNTIME_ARGUMENTS(args, callInfo);
        ScriptContext* scriptContext = function->GetScriptContext();

        if (args.Info.Count == 0)
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_NeedFunction /* TODO-ERROR: get arg name - args[0] */);
        }

        BoundFunction *boundFunction = (BoundFunction *) function;
        RecyclableObject *targetFunction = boundFunction->targetFunction;

        //
        // var o = new boundFunction()
        // a new object should be created using the actual function object
        //
        Var newVarInstance = nullptr;
        if (callInfo.Flags & CallFlags_New)
        {
            if (args.HasNewTarget())
            {
                // target has an overridden new target make a new object from the newTarget
                Var newTargetVar = args.GetNewTarget();
                AssertOrFailFastMsg(JavascriptOperators::IsConstructor(newTargetVar), "newTarget must be a constructor");
                RecyclableObject* newTarget = UnsafeVarTo<RecyclableObject>(newTargetVar);

                // Class constructors expect newTarget to be in args slot 0 (usually "this"),
                // because "this" is not constructed until we reach the most-super superclass.
                FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(targetFunction, scriptContext);
                if (functionInfo && functionInfo->IsClassConstructor())
                {
                    args.Values[0] = newVarInstance = newTarget;
                }
                else
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        args.Values[0] = newVarInstance = JavascriptOperators::CreateFromConstructor(newTarget, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
            }
            else if (!VarIs<JavascriptProxy>(targetFunction))
            {
                // No new target and target is not a proxy can make a new object in a "normal" way.
                // NewScObjectNoCtor will either construct an object or return targetFunction depending
                // on whether targetFunction is a class constructor.
                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    args.Values[0] = newVarInstance = JavascriptOperators::NewScObjectNoCtor(targetFunction, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }
            else
            {
                // target is a proxy without an overridden new target
                // give nullptr - FunctionCallTrap will make a new object
                args.Values[0] = newVarInstance;
            }
        }

        Js::Arguments actualArgs = args;

        if (boundFunction->count > 0)
        {
            // OACR thinks that this can change between here and the check in the for loop below
            const unsigned int argCount = args.Info.Count;

            uint32 newArgCount = UInt32Math::Add(boundFunction->count, args.GetLargeArgCountWithExtraArgs());
            if (newArgCount > CallInfo::kMaxCountArgs)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgListTooLarge);
            }

            Field(Var) *newValues = RecyclerNewArray(scriptContext->GetRecycler(), Field(Var), newArgCount);
            uint index = 0;

            //
            // For [[Construct]] use the newly created var instance
            // For [[Call]] use the "this" to which bind bound it.
            //
            if (callInfo.Flags & CallFlags_New)
            {
                newValues[index++] = args[0];
            }
            else
            {
                newValues[index++] = boundFunction->boundThis;
            }

            for (uint i = 0; i < boundFunction->count; i++)
            {
                newValues[index++] = boundFunction->boundArgs[i];
            }

            // Copy the extra args
            for (uint i=1; i<argCount; i++)
            {
                newValues[index++] = args[i];
            }

            if (args.HasExtraArg())
            {
                newValues[index++] = args.Values[argCount];
            }

            actualArgs = Arguments(args.Info, unsafe_write_barrier_cast<Var*>(newValues));
            actualArgs.Info.Count = boundFunction->count + argCount;

            Assert(index == actualArgs.GetLargeArgCountWithExtraArgs());
        }
        else
        {
            if (!(callInfo.Flags & CallFlags_New))
            {
                actualArgs.Values[0] = boundFunction->boundThis;
            }
        }

        Var aReturnValue = nullptr;
        BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
        {
            // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the larger argcount logic for this call.
            aReturnValue = JavascriptFunction::CallFunction<true>(targetFunction, targetFunction->GetEntryPoint(), actualArgs, /* useLargeArgCount */ true);
        }
        END_SAFE_REENTRANT_CALL

        //
        // [[Construct]] and call returned a non-object
        // return the newly created var instance
        //
        if ((callInfo.Flags & CallFlags_New) && !JavascriptOperators::IsObject(aReturnValue))
        {
            aReturnValue = newVarInstance;
        }

        return aReturnValue;
    }